

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

string * __thiscall CTape::produce(string *__return_storage_ptr__,CTape *this,string *phrase)

{
  ulong uVar1;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  for (uVar1 = 0; uVar1 < phrase->_M_string_length; uVar1 = uVar1 + 1) {
    produce_letter_abi_cxx11_(&local_50,this,(phrase->_M_dataplus)._M_p[uVar1]);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::__cxx11::string::string((string *)&local_50,(string *)__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string produce(const std::string& phrase)
        {
            std::string result;
            for (std::string::size_type i = 0; i < phrase.size(); ++i)
            {
                result += produce_letter(phrase[i]);
            }
            result = optimize(result);
            return result;
        }